

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O3

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  _Rb_tree_header *p_Var1;
  Id index;
  LocalSet *pLVar2;
  Module *pMVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  Index index_00;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar6;
  Type *pTVar7;
  Type *pTVar8;
  Expression *pEVar9;
  mapped_type *pppEVar10;
  LocalSet *this_00;
  _Base_ptr p_Var11;
  Type TVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  undefined1 auVar15 [8];
  Type in_R8;
  undefined1 local_e0 [8];
  FindAll<wasm::LocalGet> gets;
  undefined1 local_a0 [8];
  Iterator ret_1;
  undefined1 local_78 [8];
  Iterator __begin3;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_60;
  Type local_58;
  Builder builder;
  Expression *value;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *local_38;
  LocalGet *get;
  
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_e0,this->func->body);
  gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (local_e0 !=
      (undefined1  [8])
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ret_1.flexibleIterator._M_node = (_Base_ptr)&graph->locations;
    p_Var1 = &(graph->locations)._M_t._M_impl.super__Rb_tree_header;
    auVar15 = local_e0;
    do {
      local_38 = *(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   **)auVar15;
      pSVar6 = &std::__detail::
                _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)graph,(key_type *)&local_38)->
                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ;
      p_Var11 = (_Base_ptr)(pSVar6->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      p_Var13 = p_Var11;
      if (p_Var11 == (_Base_ptr)0x0) {
        p_Var13 = (_Base_ptr)(pSVar6->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
      }
      if (p_Var13 != (_Base_ptr)0x0) {
        if (p_Var13 == (_Base_ptr)&DAT_00000001) {
          p_Var13 = p_Var11;
          if (p_Var11 != (_Base_ptr)0x0) {
            p_Var13 = (pSVar6->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          p_Var13 = p_Var13 + 1;
          if (p_Var11 == (_Base_ptr)0x0) {
            p_Var13 = (_Base_ptr)
                      &(pSVar6->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
          }
          if (*(uintptr_t *)p_Var13 == 0) {
            bVar5 = Function::isParam(this->func,
                                      *(Index *)((((
                                                  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                                  *)&local_38->fixed)->fixed).
                                                 super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                                 storage._M_elems + 1));
            if (!bVar5) {
              local_a0 = (undefined1  [8])
                         (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                            *)&local_38->fixed)->fixed).
                         super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[0];
              bVar5 = wasm::Type::isNonNullable((Type *)local_a0);
              if (!bVar5) {
                bVar5 = wasm::Type::isTuple((Type *)local_a0);
                if (bVar5) {
                  local_78 = (undefined1  [8])local_a0;
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)0x0;
                  pTVar7 = (Type *)wasm::Type::size((Type *)local_78);
                  if (pTVar7 != (Type *)0x0) {
                    do {
                      pTVar8 = wasm::Type::Iterator::operator*((Iterator *)local_78);
                      local_58.id = pTVar8->id;
                      bVar5 = wasm::Type::isNonNullable(&local_58);
                      if (bVar5) goto LAB_0092c656;
                      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent = (Type *)((long)&(__begin3.
                                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                               .parent)->id + 1);
                    } while ((__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent != pTVar7) || (local_78 != (undefined1  [8])local_a0));
                  }
                }
                pEVar9 = LiteralUtils::makeZero
                                   ((Type)(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                             *)&local_38->fixed)->fixed).
                                          super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                                          _M_elems[0],this->module);
                local_78 = (undefined1  [8])local_38;
                pppEVar10 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)ret_1.flexibleIterator._M_node,(key_type *)local_78);
                **pppEVar10 = pEVar9;
              }
            }
          }
          else {
            *(undefined4 *)
             ((((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 *)&local_38->fixed)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
              _M_elems + 1) = *(undefined4 *)(*(uintptr_t *)p_Var13 + 0x10);
          }
        }
        else if (this->allowMerges == true) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                            *)&local_38->fixed)->fixed).
                         super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[0];
          index_00 = Builder::addVar((Builder *)this->func,(Function *)0x0,(Name)(auVar4 << 0x40),
                                     in_R8);
          index = *(Id *)((((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                             *)&local_38->fixed)->fixed).
                          super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + 1);
          *(Index *)((((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                        *)&local_38->fixed)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                     storage._M_elems + 1) = index_00;
          local_58.id = (uintptr_t)this->module;
          ret_1.parent._0_1_ =
               (pSVar6->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)CONCAT71(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                parent._1_7_,ret_1.parent._0_1_);
          local_60._M_node = (_Rb_tree_node_base *)0x0;
          local_a0 = (undefined1  [8])pSVar6;
          local_78 = (undefined1  [8])pSVar6;
          if ((bool)ret_1.parent._0_1_) {
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
            ret_1.fixedIndex = 0;
            ret_1._8_8_ = (pSVar6->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
          }
          else {
            local_60._M_node =
                 (pSVar6->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            ret_1.fixedIndex = (size_t)&(pSVar6->flexible)._M_t._M_impl.super__Rb_tree_header;
          }
          while (bVar5 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ::
                         IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                         ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                       *)local_78,(Iterator *)local_a0), !bVar5) {
            p_Var14 = local_60._M_node + 1;
            if ((char)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent != '\0') {
              p_Var14 = (_Rb_tree_node_base *)
                        ((((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                            *)local_78)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                         storage._M_elems +
                        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index);
            }
            pLVar2 = *(LocalSet **)p_Var14;
            if (pLVar2 == (LocalSet *)0x0) {
              bVar5 = Function::isParam(this->func,index);
              if (bVar5) {
                TVar12 = Function::getLocalType(this->func,index);
                pEVar9 = (Expression *)
                         MixedArena::allocSpace((MixedArena *)(local_58.id + 0x158),0x18,8);
                pEVar9->_id = LocalGetId;
                pEVar9[1]._id = index;
                (pEVar9->type).id = TVar12.id;
                builder.wasm = (Module *)Builder::makeLocalSet((Builder *)&local_58,index_00,pEVar9)
                ;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                           &this->functionPrepends,(Expression **)&builder);
              }
            }
            else {
              pMVar3 = (Module *)pLVar2->value;
              TVar12.id = (uintptr_t)
                          (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                             *)&local_38->fixed)->fixed).
                          super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[0];
              builder.wasm = pMVar3;
              this_00 = (LocalSet *)
                        MixedArena::allocSpace((MixedArena *)(local_58.id + 0x158),0x20,8);
              (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id =
                   LocalSetId;
              (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
                   = 0;
              this_00->index = index_00;
              this_00->value = (Expression *)pMVar3;
              LocalSet::makeTee(this_00,TVar12);
              pLVar2->value = (Expression *)this_00;
              p_Var11 = (graph->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (p_Var11 != (_Base_ptr)0x0) {
                p_Var13 = &p_Var1->_M_header;
                do {
                  if (*(Module **)(p_Var11 + 1) >= builder.wasm) {
                    p_Var13 = p_Var11;
                  }
                  p_Var11 = (&p_Var11->_M_left)[*(Module **)(p_Var11 + 1) < builder.wasm];
                } while (p_Var11 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
                   ((Module *)((_Rb_tree_header *)p_Var13)->_M_node_count <= builder.wasm)) {
                  pppEVar10 = std::
                              map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                              ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                            *)ret_1.flexibleIterator._M_node,(key_type *)&builder);
                  if (*pppEVar10 != &pLVar2->value) {
                    __assert_fail("graph.locations[value] == &set->value",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SSAify.cpp"
                                  ,0xab,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
                  }
                  pppEVar10 = std::
                              map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                              ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                            *)ret_1.flexibleIterator._M_node,(key_type *)&builder);
                  *pppEVar10 = &this_00->value;
                }
              }
            }
            if ((char)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent == '\x01') {
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                   __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index + 1;
            }
            else {
              local_60._M_node = (_Base_ptr)std::_Rb_tree_increment(local_60._M_node);
            }
          }
        }
      }
LAB_0092c656:
      auVar15 = (undefined1  [8])((long)auVar15 + 8);
    } while (auVar15 !=
             (undefined1  [8])
             gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e0,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_e0);
  }
  return;
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSetses[get];
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }